

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regression_suite.cpp
# Opt level: O0

void double_suite::run(void)

{
  test_ctor();
  test_same();
  test_linear_increase_slope_1();
  test_linear_increase_slope_2();
  test_linear_increase_slope_1_absolute_error();
  test_linear_increase_slope_1_relative_error();
  test_exponential_increase();
  test_scatter();
  return;
}

Assistant:

void run()
{
    test_ctor();
    test_same();
    test_linear_increase_slope_1();
    test_linear_increase_slope_2();
    test_linear_increase_slope_1_absolute_error();
    test_linear_increase_slope_1_relative_error();
    test_exponential_increase();
    test_scatter();
}